

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimacs.cc
# Opt level: O2

InputGraph read_dimacs(ifstream *infile,string *filename)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  GraphFileError *pGVar6;
  string *in_RDX;
  string_view l;
  string_type local_c0;
  string *local_a0;
  smatch match;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string line;
  
  local_a0 = filename;
  InputGraph::InputGraph((InputGraph *)infile,0,false,false);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    do {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_a0,(string *)&line);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        if ((*(byte *)((long)&local_a0[1]._M_dataplus._M_p +
                      *(long *)((local_a0->_M_dataplus)._M_p + -0x18)) & 2) != 0) {
          iVar2 = 0;
          while( true ) {
            iVar3 = InputGraph::size((InputGraph *)infile);
            if (iVar3 <= iVar2) break;
            std::__cxx11::to_string((string *)&match,iVar2 + 1);
            l._M_str = (char *)match.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
            l._M_len = (size_t)match.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
            InputGraph::set_vertex_name((InputGraph *)infile,iVar2,l);
            std::__cxx11::string::~string((string *)&match);
            iVar2 = iVar2 + 1;
          }
          std::__cxx11::string::~string((string *)&line);
          return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                 (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)infile;
        }
        pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&match,"error reading file",(allocator<char> *)&local_c0);
        GraphFileError::GraphFileError(pGVar6,in_RDX,(string *)&match,true);
        __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
    } while (line._M_string_length == 0);
    if (read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                   comment_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_,
                   "c(\\s.*)?",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                             comment_abi_cxx11_);
      }
    }
    if (read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                   problem_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_,
                   "p\\s+(edge|col)\\s+(\\d+)\\s+(\\d+)?\\s*",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                             problem_abi_cxx11_);
      }
    }
    if (read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                   edge_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_,
                   "e\\s+(\\d+)\\s+(\\d+)\\s*",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                             edge_abi_cxx11_);
      }
    }
    match = (smatch)ZEXT1632(ZEXT816(0) << 0x40);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&line,&match,
                       &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_
                       ,0);
    if (!bVar1) {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&line,&match,
                         &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                          problem_abi_cxx11_,0);
      if (bVar1) {
        iVar2 = InputGraph::size((InputGraph *)infile);
        if (iVar2 != 0) {
          pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"multiple \'p\' lines encountered",
                     (allocator<char> *)&local_70);
          GraphFileError::GraphFileError(pGVar6,in_RDX,&local_c0,true);
          __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_c0,&match,2);
        iVar2 = std::__cxx11::stoi(&local_c0,(size_t *)0x0,10);
        InputGraph::resize((InputGraph *)infile,iVar2);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (&line,&match,
                           &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                            edge_abi_cxx11_,0);
        if (!bVar1) {
          pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::operator+(&local_70,"cannot parse line \'",&line);
          std::operator+(&local_c0,&local_70,"\'");
          GraphFileError::GraphFileError(pGVar6,in_RDX,&local_c0,true);
          __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_c0,&match,1);
        iVar2 = std::__cxx11::stoi(&local_c0,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_c0,&match,2);
        iVar3 = std::__cxx11::stoi(&local_c0,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_c0);
        if ((iVar2 == 0) || (iVar3 == 0)) {
LAB_0013b0fb:
          pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::operator+(&local_70,"line \'",&line);
          std::operator+(&local_c0,&local_70,"\' edge index out of bounds");
          GraphFileError::GraphFileError(pGVar6,in_RDX,&local_c0,true);
          __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        iVar4 = InputGraph::size((InputGraph *)infile);
        if (iVar4 < iVar2) goto LAB_0013b0fb;
        iVar4 = InputGraph::size((InputGraph *)infile);
        if (iVar4 < iVar3) goto LAB_0013b0fb;
        InputGraph::add_edge((InputGraph *)infile,iVar2 + -1,iVar3 + -1);
      }
    }
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&match);
  } while( true );
}

Assistant:

auto read_dimacs(ifstream && infile, const string & filename) -> InputGraph
{
    InputGraph result{0, false, false};

    string line;
    while (getline(infile, line)) {
        if (line.empty())
            continue;

        /* Lines are comments, a problem description (contains the number of
         * vertices), or an edge. */
        static const regex
            comment{R"(c(\s.*)?)"},
            problem{R"(p\s+(edge|col)\s+(\d+)\s+(\d+)?\s*)"},
            edge{R"(e\s+(\d+)\s+(\d+)\s*)"};

        smatch match;
        if (regex_match(line, match, comment)) {
            /* Comment, ignore */
        }
        else if (regex_match(line, match, problem)) {
            /* Problem. Specifies the size of the graph. Must happen exactly
             * once. */
            if (0 != result.size())
                throw GraphFileError{filename, "multiple 'p' lines encountered", true};
            result.resize(stoi(match.str(2)));
        }
        else if (regex_match(line, match, edge)) {
            /* An edge. DIMACS files are 1-indexed. We assume we've already had
             * a problem line (if not our size will be 0, so we'll throw). */
            int a{stoi(match.str(1))}, b{stoi(match.str(2))};
            if (0 == a || 0 == b || a > result.size() || b > result.size())
                throw GraphFileError{filename, "line '" + line + "' edge index out of bounds", true};
            result.add_edge(a - 1, b - 1);
        }
        else
            throw GraphFileError{filename, "cannot parse line '" + line + "'", true};
    }

    if (! infile.eof())
        throw GraphFileError{filename, "error reading file", true};

    for (int v = 0; v < result.size(); ++v)
        result.set_vertex_name(v, to_string(v + 1));

    return result;
}